

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O0

PAL_ERROR __thiscall CorUnix::CPalThread::Leave(CPalThread *this,PAL_Boundary param_1)

{
  PAL_ERROR palError;
  PAL_Boundary param_1_local;
  CPalThread *this_local;
  
  if ((this->m_fInPal & 1U) == 0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    this_local._4_4_ = 0x32;
  }
  else {
    this->m_fInPal = false;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

PAL_ERROR CPalThread::Leave(PAL_Boundary /* boundary */)
{
    if (!m_fInPal)
    {
        WARN("Leave called on a thread that is not running in this PAL\n");
        return ERROR_NOT_SUPPORTED;
    }

    PAL_ERROR palError = ERROR_SUCCESS;

    m_fInPal = FALSE;

    return palError;
}